

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int transfer_set_state(TRANSFER_HANDLE transfer,AMQP_VALUE state_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    iVar2 = 0x1ee1;
  }
  else {
    iVar2 = 0x1ef1;
    if (state_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(state_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(transfer->composite_value,7,item_value);
        iVar2 = 0x1ef7;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int transfer_set_state(TRANSFER_HANDLE transfer, AMQP_VALUE state_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        AMQP_VALUE state_amqp_value;
        if (state_value == NULL)
        {
            state_amqp_value = NULL;
        }
        else
        {
            state_amqp_value = amqpvalue_clone(state_value);
        }
        if (state_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(transfer_instance->composite_value, 7, state_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(state_amqp_value);
        }
    }

    return result;
}